

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

string * __thiscall
pbrt::ParsedScene::ToString_abi_cxx11_(string *__return_storage_ptr__,ParsedScene *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::CameraSceneEntity_const&,pbrt::SceneEntity_const&,pbrt::SceneEntity_const&,pbrt::SceneEntity_const&,pbrt::SceneEntity_const&,pbrt::SceneEntity_const&,std::vector<std::pair<std::__cxx11::string,pbrt::SceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::SceneEntity>>>const&,std::vector<pbrt::SceneEntity,std::allocator<pbrt::SceneEntity>>const&,std::map<std::__cxx11::string,pbrt::TransformedSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::TransformedSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::vector<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>,std::allocator<std::pair<std::__cxx11::string,pbrt::TextureSceneEntity>>>const&,std::map<std::__cxx11::string,pbrt::InstanceDefinitionSceneEntity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pbrt::InstanceDefinitionSceneEntity>>>const&,std::vector<pbrt::LightSceneEntity,std::allocator<pbrt::LightSceneEntity>>const&,std::vector<pbrt::ShapeSceneEntity,std::allocator<pbrt::ShapeSceneEntity>>const&,std::vector<pbrt::InstanceSceneEntity,std::allocator<pbrt::InstanceSceneEntity>>const&>
            (__return_storage_ptr__,
             "[ ParsedScene camera: %s film: %s sampler: %s integrator: %s filter: %s accelerator: %s namedMaterials: %s materials: %s media: %s floatTextures: %s spectrumTextures: %s instanceDefinitions: %s lights: %s shapes: %s instances: %s ]"
             ,&this->camera,&this->film,&this->sampler,&this->integrator,&this->filter,
             &this->accelerator,&this->namedMaterials,&this->materials,&this->media,
             &this->floatTextures,&this->spectrumTextures,&this->instanceDefinitions,&this->lights,
             &this->shapes,&this->instances);
  return __return_storage_ptr__;
}

Assistant:

std::string ParsedScene::ToString() const {
    return StringPrintf("[ ParsedScene camera: %s film: %s sampler: %s integrator: %s "
                        "filter: %s accelerator: %s namedMaterials: %s materials: %s "
                        "media: %s floatTextures: %s spectrumTextures: %s "
                        "instanceDefinitions: %s lights: %s "
                        "shapes: %s instances: %s ]",
                        camera, film, sampler, integrator, filter, accelerator,
                        namedMaterials, materials, media, floatTextures, spectrumTextures,
                        instanceDefinitions, lights, shapes, instances);
}